

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O0

void FT_Outline_Transform(FT_Outline *outline,FT_Matrix *matrix)

{
  FT_Vector *pFVar1;
  FT_Vector *limit;
  FT_Vector *vec;
  FT_Matrix *matrix_local;
  FT_Outline *outline_local;
  
  if ((outline != (FT_Outline *)0x0) && (matrix != (FT_Matrix *)0x0)) {
    limit = outline->points;
    pFVar1 = limit + (int)outline->n_points;
    for (; limit < pFVar1; limit = limit + 1) {
      FT_Vector_Transform(limit,matrix);
    }
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Outline_Transform( const FT_Outline*  outline,
                        const FT_Matrix*   matrix )
  {
    FT_Vector*  vec;
    FT_Vector*  limit;


    if ( !outline || !matrix )
      return;

    vec   = outline->points;
    limit = vec + outline->n_points;

    for ( ; vec < limit; vec++ )
      FT_Vector_Transform( vec, matrix );
  }